

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

Vec_Ptr_t * Llb_ManGroupCollect(Llb_Grp_t *pGroup)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void *pvVar2;
  Aig_Obj_t *pObj;
  int iVar3;
  Vec_Ptr_t *p;
  
  vNodes = Vec_PtrAlloc(100);
  Aig_ManIncrementTravId(pGroup->pMan->pAig);
  for (iVar3 = 0; iVar3 < pGroup->vIns->nSize; iVar3 = iVar3 + 1) {
    pvVar2 = Vec_PtrEntry(pGroup->vIns,iVar3);
    *(int *)((long)pvVar2 + 0x20) = pGroup->pMan->pAig->nTravIds;
  }
  iVar3 = 0;
  while( true ) {
    p = pGroup->vOuts;
    iVar1 = p->nSize;
    if (iVar1 <= iVar3) break;
    pvVar2 = Vec_PtrEntry(p,iVar3);
    *(int *)((long)pvVar2 + 0x20) = pGroup->pMan->pAig->nTravIds + -1;
    iVar3 = iVar3 + 1;
  }
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p,iVar3);
    Llb_ManGroupCollect_rec(pGroup->pMan->pAig,pObj,vNodes);
    p = pGroup->vOuts;
    iVar1 = p->nSize;
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Llb_ManGroupCollect( Llb_Grp_t * pGroup )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId( pGroup->pMan->pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        Aig_ObjSetTravIdCurrent( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Aig_ObjSetTravIdPrevious( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Llb_ManGroupCollect_rec( pGroup->pMan->pAig, pObj, vNodes );
    return vNodes;
}